

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  pointer ppVar4;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  Extension *local_80;
  Extension *extension;
  byte local_61;
  LogMessage local_60;
  _Self local_28;
  _Self local_20;
  iterator iter;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node._4_4_ = number;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,(key_type *)((long)&iter._M_node + 4));
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar1 = std::operator!=(&local_20,&local_28);
  local_61 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x248);
    local_61 = 1;
    pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: iter != extensions_.end(): ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)((long)&extension + 3),pLVar3);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_20);
  local_80 = &ppVar4->second;
  local_b9 = 0;
  if (((ppVar4->second).is_repeated & 1U) == 0) {
    LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x24b);
    local_b9 = 1;
    pLVar3 = LogMessage::operator<<(&local_b8,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_ba,pLVar3);
  }
  if ((local_b9 & 1) != 0) {
    LogMessage::~LogMessage(&local_b8);
  }
  CVar2 = anon_unknown_0::cpp_type(local_80->type);
  switch(CVar2) {
  case CPPTYPE_INT32:
    RepeatedField<int>::RemoveLast((local_80->field_0).repeated_int32_value);
    break;
  case CPPTYPE_INT64:
    RepeatedField<long>::RemoveLast((local_80->field_0).repeated_int64_value);
    break;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::RemoveLast((local_80->field_0).repeated_uint32_value);
    break;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::RemoveLast((local_80->field_0).repeated_uint64_value);
    break;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::RemoveLast((local_80->field_0).repeated_double_value);
    break;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::RemoveLast((local_80->field_0).repeated_float_value);
    break;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::RemoveLast((local_80->field_0).repeated_bool_value);
    break;
  case CPPTYPE_ENUM:
    RepeatedField<int>::RemoveLast((local_80->field_0).repeated_int32_value);
    break;
  case CPPTYPE_STRING:
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::RemoveLast((local_80->field_0).repeated_string_value);
    break;
  case CPPTYPE_MESSAGE:
    RepeatedPtrField<google::protobuf::MessageLite>::RemoveLast
              ((local_80->field_0).repeated_message_value);
  }
  return;
}

Assistant:

void ExtensionSet::RemoveLast(int number) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->RemoveLast();
      break;
  }
}